

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O0

void __thiscall
flatbuffers::JsonPrinter::GenField<int>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  voffset_t field;
  bool bVar1;
  int iVar2;
  int *piVar3;
  _Optional_payload_base<int> local_30;
  Optional<int> opt;
  int indent_local;
  bool fixed_local;
  Table *table_local;
  FieldDef *fd_local;
  JsonPrinter *this_local;
  
  opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._M_payload.
  _M_value = indent;
  opt.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._7_1_ =
       fixed;
  if (fixed) {
    iVar2 = Struct::GetField<int>((Struct *)table,(uint)(fd->value).offset);
    PrintScalar<int>(this,iVar2,&(fd->value).type,
                     opt.super__Optional_base<int,_true,_true>._M_payload.
                     super__Optional_payload_base<int>._M_payload._M_value);
  }
  else {
    bVar1 = FieldDef::IsOptional(fd);
    if (bVar1) {
      local_30 = (_Optional_payload_base<int>)Table::GetOptional<int,int>(table,(fd->value).offset);
      bVar1 = std::optional::operator_cast_to_bool((optional *)&local_30);
      if (bVar1) {
        piVar3 = std::optional<int>::operator*((optional<int> *)&local_30);
        PrintScalar<int>(this,*piVar3,&(fd->value).type,
                         opt.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int>._M_payload._M_value);
      }
      else {
        std::__cxx11::string::operator+=((string *)this->text,"null");
      }
    }
    else {
      field = (fd->value).offset;
      iVar2 = GetFieldDefault<int>(fd);
      iVar2 = Table::GetField<int>(table,field,iVar2);
      PrintScalar<int>(this,iVar2,&(fd->value).type,
                       opt.super__Optional_base<int,_true,_true>._M_payload.
                       super__Optional_payload_base<int>._M_payload._M_value);
    }
  }
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }